

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::Options::Options(Options *this,string *program,string *help_string)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  std::__cxx11::string::string((string *)this,(string *)program);
  std::__cxx11::string::string((string *)&this->m_help_string,(string *)help_string);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_custom_help,"[OPTION...]",&local_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_positional_help,"positional parameters",&local_2a);
  this->m_show_positional = false;
  this->m_allow_unrecognised = false;
  this->m_width = 0x4c;
  this->m_tab_expansion = false;
  std::
  make_shared<std::unordered_map<std::__cxx11::string,std::shared_ptr<cxxopts::OptionDetails>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cxxopts::OptionDetails>>>>>
            ();
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_positional_set)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_positional_set)._M_h._M_bucket_count = 0;
  (this->m_positional_set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_positional_set)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->m_positional_set)._M_h._M_rehash_policy = 0;
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_positional_set)._M_h._M_buckets = &(this->m_positional_set)._M_h._M_single_bucket;
  (this->m_positional_set)._M_h._M_bucket_count = 1;
  (this->m_positional_set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_positional_set)._M_h._M_element_count = 0;
  (this->m_positional_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->m_help)._M_t._M_impl.super__Rb_tree_header;
  (this->m_positional_set)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_positional_set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->m_help)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_help)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_option_list).
  super__List_base<cxxopts::OptionDetails,_std::allocator<cxxopts::OptionDetails>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_option_list;
  (this->m_option_list).
  super__List_base<cxxopts::OptionDetails,_std::allocator<cxxopts::OptionDetails>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_option_list;
  (this->m_option_list).
  super__List_base<cxxopts::OptionDetails,_std::allocator<cxxopts::OptionDetails>_>._M_impl._M_node.
  _M_size = 0;
  (this->m_option_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_option_map)._M_h._M_bucket_count = 0;
  (this->m_option_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_option_map)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->m_option_map)._M_h._M_rehash_policy = 0;
  (this->m_option_map)._M_h._M_buckets = &(this->m_option_map)._M_h._M_single_bucket;
  (this->m_option_map)._M_h._M_bucket_count = 1;
  (this->m_option_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_option_map)._M_h._M_element_count = 0;
  (this->m_option_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_option_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_option_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit Options(std::string program, std::string help_string = "")
    : m_program(std::move(program))
    , m_help_string(toLocalString(std::move(help_string)))
    , m_custom_help("[OPTION...]")
    , m_positional_help("positional parameters")
    , m_show_positional(false)
    , m_allow_unrecognised(false)
    , m_width(76)
    , m_tab_expansion(false)
    , m_options(std::make_shared<OptionMap>())
    {
    }